

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readclose.c
# Opt level: O0

int readclose_append(int fd,stralloc *sa,uint bufsize)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int r;
  uint bufsize_local;
  stralloc *sa_local;
  int fd_local;
  
  while( true ) {
    do {
      iVar1 = stralloc_readyplus(sa,bufsize);
      if (iVar1 == 0) {
        close(fd);
        return -1;
      }
      sVar2 = read(fd,sa->s + sa->len,(ulong)bufsize);
      iVar1 = (int)sVar2;
    } while ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 == error_intr));
    if (iVar1 < 1) break;
    sa->len = iVar1 + sa->len;
  }
  close(fd);
  return iVar1;
}

Assistant:

int readclose_append(int fd,stralloc *sa,unsigned int bufsize)
{
  int r;
  for (;;) {
    if (!stralloc_readyplus(sa,bufsize)) { close(fd); return -1; }
    r = read(fd,sa->s + sa->len,bufsize);
    if (r == -1) if (errno == error_intr) continue;
    if (r <= 0) { close(fd); return r; }
    sa->len += r;
  }
}